

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

void __thiscall tinyxml2::XMLNode::SetValue(XMLNode *this,char *str,bool staticMem)

{
  char *pcVar1;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,staticMem) != 0) {
    if ((((this->_value)._flags & 0x200) != 0) &&
       (pcVar1 = (this->_value)._start, pcVar1 != (char *)0x0)) {
      operator_delete__(pcVar1);
    }
    (this->_value)._flags = 0;
    (this->_value)._start = (char *)0x0;
    (this->_value)._end = (char *)0x0;
    (this->_value)._start = str;
    return;
  }
  StrPair::SetStr(&this->_value,str,0);
  return;
}

Assistant:

void XMLNode::SetValue( const char* str, bool staticMem )
{
    if ( staticMem ) {
        _value.SetInternedStr( str );
    }
    else {
        _value.SetStr( str );
    }
}